

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void google::LogDestination::SetLogFilenameExtension(char *ext)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  LogDestination *this;
  long lVar4;
  MutexLock l;
  MutexLock local_40;
  MutexLock local_38;
  
  local_40.mu_ = (Mutex *)log_mutex;
  if (log_mutex[0x38] == '\x01') {
    iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)log_mutex);
    if (iVar3 != 0) {
LAB_00115495:
      abort();
    }
  }
  lVar4 = 0;
  do {
    if ((&log_destinations_)[lVar4] == 0) {
      this = (LogDestination *)operator_new(0xe0);
      LogDestination(this,(LogSeverity)lVar4,(char *)0x0);
      (&log_destinations_)[lVar4] = this;
    }
    lVar1 = (&log_destinations_)[lVar4];
    local_38.mu_ = (Mutex *)(lVar1 + 8);
    if (*(char *)(lVar1 + 0x40) == '\x01') {
      iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_38.mu_);
      if (iVar3 != 0) goto LAB_00115495;
    }
    iVar3 = std::__cxx11::string::compare((char *)(lVar1 + 0x90));
    if (iVar3 != 0) {
      if (*(FILE **)(lVar1 + 0xb0) != (FILE *)0x0) {
        fclose(*(FILE **)(lVar1 + 0xb0));
        *(undefined8 *)(lVar1 + 0xb0) = 0;
        *(undefined4 *)(lVar1 + 200) = 0x1f;
      }
      pcVar2 = *(char **)(lVar1 + 0x98);
      strlen(ext);
      std::__cxx11::string::_M_replace((ulong)(lVar1 + 0x90),0,pcVar2,(ulong)ext);
    }
    ::glog_internal_namespace_::MutexLock::~MutexLock(&local_38);
    lVar4 = lVar4 + 1;
    if (lVar4 == 4) {
      ::glog_internal_namespace_::MutexLock::~MutexLock(&local_40);
      return;
    }
  } while( true );
}

Assistant:

inline void LogDestination::SetLogFilenameExtension(const char* ext) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&log_mutex);
  for ( int severity = 0; severity < NUM_SEVERITIES; ++severity ) {
    log_destination(severity)->fileobject_.SetExtension(ext);
  }
}